

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

string * __thiscall
t_py_generator::py_imports_abi_cxx11_(string *__return_storage_ptr__,t_py_generator *this)

{
  ostream *poVar1;
  undefined1 local_190 [8];
  ostringstream ss;
  t_py_generator *this_local;
  
  ss._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "from thrift.Thrift import TType, TMessageType, TFrozenDict, TException, TApplicationException"
                          );
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"from thrift.protocol.TProtocol import TProtocolException");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"from thrift.TRecursive import fix_spec");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  if ((this->gen_utf8strings_ & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar1,"import sys");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::py_imports() {
  ostringstream ss;
  ss << "from thrift.Thrift import TType, TMessageType, TFrozenDict, TException, "
        "TApplicationException"
     << endl
     << "from thrift.protocol.TProtocol import TProtocolException"
     << endl
     << "from thrift.TRecursive import fix_spec"
     << endl;

  if (gen_utf8strings_) {
    ss << endl << "import sys";
  }
  return ss.str();
}